

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.cpp
# Opt level: O2

void __thiscall MinVR::VRMain::synchronizeAndProcessEvents(VRMain *this)

{
  pointer ppVVar1;
  VRInputDevice *pVVar2;
  VRNetInterface *pVVar3;
  pointer ppVVar4;
  VREventHandler *pVVar5;
  runtime_error *this_00;
  int f_1;
  int f;
  ulong uVar6;
  double dVar7;
  allocator<char> local_293;
  allocator<char> local_292;
  allocator<char> local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  VRDataQueue eventQueue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  VRDataIndex local_220;
  _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  local_188;
  VRDataIndex frameStartEvent;
  VRDataIndex local_c0;
  
  if (this->_frame == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&eventQueue,"\n\n==== ",&local_293)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"RUNNING MINVR MAINLOOP",&local_291);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eventQueue,
                   &local_290);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240," ====\n",&local_292);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &frameStartEvent,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220,
                   &local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&eventQueue);
    std::ostream::write((char *)&std::cout,frameStartEvent._theIndex._M_t._M_impl._0_8_);
    std::__cxx11::string::~string((string *)&frameStartEvent);
  }
  if (this->_initialized != false) {
    eventQueue._dataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &eventQueue._dataMap._M_t._M_impl.super__Rb_tree_header._M_header;
    eventQueue._dataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    eventQueue._dataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    eventQueue._dataMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    eventQueue._dataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         eventQueue._dataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"FrameStart",(allocator<char> *)&local_290);
    dVar7 = VRSystem::getTime(false);
    VRAnalogEvent::createValidDataIndex(&frameStartEvent,(string *)&local_220,(float)dVar7);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"AnalogValue",(allocator<char> *)&local_240);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"ElapsedSeconds",&local_293);
    VRDataIndex::linkNode(&frameStartEvent,(string *)&local_220,&local_290,0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_220);
    VRDataIndex::VRDataIndex(&local_c0,&frameStartEvent);
    VRDataQueue::push(&eventQueue,&local_c0);
    VRDataIndex::~VRDataIndex(&local_c0);
    uVar6 = 0;
    while( true ) {
      ppVVar1 = (this->_inputDevices).
                super__Vector_base<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_inputDevices).
                        super__Vector_base<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3) <= uVar6)
      break;
      pVVar2 = ppVVar1[uVar6];
      (*pVVar2->_vptr_VRInputDevice[2])(pVVar2,&eventQueue);
      uVar6 = uVar6 + 1;
    }
    pVVar3 = this->_net;
    if (pVVar3 != (VRNetInterface *)0x0) {
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::_Rb_tree(&local_188,
                 (_Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                  *)&eventQueue);
      (**pVVar3->_vptr_VRNetInterface)(&local_220,pVVar3,&local_188);
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::operator=((_Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                   *)&eventQueue,
                  (_Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                   *)&local_220);
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                   *)&local_220);
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::~_Rb_tree(&local_188);
    }
    while (eventQueue._dataMap._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      for (uVar6 = 0;
          ppVVar4 = (this->_eventHandlers).
                    super__Vector_base<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar6 < (ulong)((long)(this->_eventHandlers).
                                super__Vector_base<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >> 3);
          uVar6 = uVar6 + 1) {
        pVVar5 = ppVVar4[uVar6];
        VRDataQueue::getFirst(&local_220,&eventQueue);
        (**pVVar5->_vptr_VREventHandler)(pVVar5,&local_220);
        VRDataIndex::~VRDataIndex(&local_220);
      }
      VRDataQueue::pop(&eventQueue);
    }
    VRDataIndex::~VRDataIndex(&frameStartEvent);
    std::
    _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                 *)&eventQueue);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"VRMain not initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
VRMain::synchronizeAndProcessEvents() {

  if (_frame == 0) {
    VRLOG_H1("RUNNING MINVR MAINLOOP");
  }

	if (!_initialized) {
		throw std::runtime_error("VRMain not initialized.");
	}

  VRDataQueue eventQueue;

  // Add a standard "FrameStart" event at the beginning of each frame
  VRDataIndex frameStartEvent =
      VRAnalogEvent::createValidDataIndex("FrameStart", (float)VRSystem::getTime());
  // by default the data will be placed in a field called "AnalogValue".  The
  // next line is not strictly necessary, but it demonstrates how to add an
  // entry to the index with a more descriptive name for event's data payload
  // additional entries could also be added here, for example, might be useful
  // to include delta time since last frame and even the current framerate.
  // Adding more fields is fine as long as the VRSystem::getTime() remains the
  // default data stored in the AnalogValue field.
  frameStartEvent.linkNode("AnalogValue", "ElapsedSeconds");
  eventQueue.push(frameStartEvent);

  for (int f = 0; f < _inputDevices.size(); f++) {
    _inputDevices[f]->appendNewInputEventsSinceLastCall(&eventQueue);
  }

	// SYNCHRONIZATION POINT #1: When this function returns, we know
	// that all MinVR nodes have the same list of input events generated
	// since the last call to synchronizeAndProcessEvents(..).  So,
	// every node will process the same set of input events this frame.
  if (_net != NULL) {
    eventQueue = _net->syncEventDataAcrossAllNodes(eventQueue);
  }

  while (eventQueue.notEmpty()) {
    // Unpack the next item from the queue and invoke the user's
    // callback on it.
    for (int f = 0; f < _eventHandlers.size(); f++) {
      _eventHandlers[f]->onVREvent(eventQueue.getFirst());
    }

    // Remove the item from the queue.
    eventQueue.pop();
  }

  // At this point the eventQueue should be empty with all its events
  // distributed to the user callback.  Our job here is done and we can
  // safely get out.
}